

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O3

void __thiscall
VideoEngine::VideoEngine
          (VideoEngine *this,Resources *resources,shared_ptr<renderdesc::Pipeline> *pipeline)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pTVar3;
  pointer pbVar4;
  pointer pPVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  PolledTexture *this_00;
  pointer psVar9;
  element_type *peVar10;
  pointer psVar11;
  ulong uVar12;
  pointer psVar13;
  pointer pFVar14;
  pointer pTVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar16;
  pointer pPVar17;
  Framebuffer fb;
  undefined1 local_78 [64];
  pointer local_38;
  
  this->resources_ = resources;
  (this->pipeline_).super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->pipeline_).super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_78._24_8_ = &this->textures_;
  local_78._48_8_ = &this->framebuffer_;
  local_78._32_8_ = &this->sources_;
  local_78._56_8_ = &this->programs_;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->programs_).super__Vector_base<PolledShaderProgram,_std::allocator<PolledShaderProgram>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources_).
  super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->framebuffer_).
  super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures_).
  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->canvas_)._M_t.
  super___uniq_ptr_impl<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>._M_t.
  super__Tuple_impl<0UL,_VideoEngine::Canvas_*,_std::default_delete<VideoEngine::Canvas>_>.
  super__Head_base<0UL,_VideoEngine::Canvas_*,_false>._M_head_impl = (Canvas *)0x0;
  peVar10 = (pipeline->super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pTVar15 = (peVar10->textures).
            super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar3 = (peVar10->textures).
           super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_78._40_8_ = pipeline;
  if (pTVar15 != pTVar3) {
    do {
      if ((pTVar15->file)._M_string_length == 0) {
        this_00 = (PolledTexture *)operator_new(0x28);
        PolledTexture::PolledTexture(this_00,pTVar15->w,pTVar15->h,pTVar15->pixel_type);
        local_78._0_8_ = this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<PolledTexture*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),this_00);
        std::vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>::
        emplace_back<std::shared_ptr<PolledTexture>>
                  ((vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>
                    *)local_78._24_8_,(shared_ptr<PolledTexture> *)local_78);
      }
      else {
        Resources::getTexture((Resources *)local_78,(string *)this->resources_);
        std::vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>::
        emplace_back<std::shared_ptr<PolledTexture>>
                  ((vector<std::shared_ptr<PolledTexture>,std::allocator<std::shared_ptr<PolledTexture>>>
                    *)local_78._24_8_,(shared_ptr<PolledTexture> *)local_78);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      pTVar15 = pTVar15 + 1;
    } while (pTVar15 != pTVar3);
    peVar10 = (element_type *)(((path *)local_78._40_8_)->_M_pathname)._M_dataplus._M_p;
  }
  pFVar14 = (peVar10->framebuffers).
            super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_38 = (peVar10->framebuffers).
             super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (pFVar14 != local_38) {
    do {
      local_78._0_8_ = (PolledTexture *)0x0;
      local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      glGenFramebuffers(1,local_78 + 0xc);
      glBindFramebuffer(0x8d40,local_78._12_4_);
      GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, fb.name)");
      iVar8 = pFVar14->textures_count;
      if (0 < iVar8) {
        uVar12 = 0;
        do {
          uVar1 = pFVar14->textures[uVar12];
          psVar9 = (this->textures_).
                   super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((long)(int)uVar1 < 0) ||
             ((int)((ulong)((long)(this->textures_).
                                  super__Vector_base<std::shared_ptr<PolledTexture>,_std::allocator<std::shared_ptr<PolledTexture>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9) >> 4)
              <= (int)uVar1)) {
            aAppDebugPrintf("[CRASH] Fb texture %d OOB %d (max %d)",uVar12 & 0xffffffff,(ulong)uVar1
                           );
            aAppTerminate(-1);
            psVar9 = *(pointer *)local_78._24_8_;
          }
          bVar7 = Framebuffer::attachColorTexture
                            ((Framebuffer *)local_78,(int)uVar12,
                             &(psVar9[(int)uVar1].
                               super___shared_ptr<PolledTexture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->texture_);
          if (!bVar7) {
            aAppDebugPrintf("[CRASH] Framebuffer %d is not complete",
                            (ulong)((long)(this->framebuffer_).
                                          super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->framebuffer_).
                                         super__Vector_base<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
            aAppTerminate(-1);
          }
          uVar12 = uVar12 + 1;
          iVar8 = pFVar14->textures_count;
        } while ((long)uVar12 < (long)iVar8);
      }
      local_78._8_4_ = iVar8;
      std::vector<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_>::
      emplace_back<VideoEngine::Framebuffer>
                ((vector<VideoEngine::Framebuffer,_std::allocator<VideoEngine::Framebuffer>_> *)
                 local_78._48_8_,(Framebuffer *)local_78);
      glDeleteFramebuffers(1,local_78 + 0xc);
      pFVar14 = pFVar14 + 1;
    } while (pFVar14 != local_38);
  }
  glBindFramebuffer(0x8d40,0);
  GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, 0)");
  uVar6 = local_78._40_8_;
  peVar10 = (element_type *)(((path *)local_78._40_8_)->_M_pathname)._M_dataplus._M_p;
  pbVar16 = (peVar10->shader_filenames).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = *(pointer *)
            ((long)&(peVar10->shader_filenames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl + 8);
  if (pbVar16 != pbVar4) {
    do {
      Resources::getShaderSource((Resources *)local_78,(string *)this->resources_);
      std::
      vector<std::shared_ptr<PolledShaderSource>,std::allocator<std::shared_ptr<PolledShaderSource>>>
      ::emplace_back<std::shared_ptr<PolledShaderSource>>
                ((vector<std::shared_ptr<PolledShaderSource>,std::allocator<std::shared_ptr<PolledShaderSource>>>
                  *)local_78._32_8_,(shared_ptr<PolledShaderSource> *)local_78);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != pbVar4);
    peVar10 = (element_type *)(((path *)uVar6)->_M_pathname)._M_dataplus._M_p;
  }
  pPVar5 = (peVar10->programs).
           super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar17 = (peVar10->programs).
                 super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                 _M_impl.super__Vector_impl_data._M_start; pPVar17 != pPVar5; pPVar17 = pPVar17 + 1)
  {
    uVar1 = pPVar17->vertex;
    psVar13 = (this->sources_).
              super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar11 = (this->sources_).
              super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar12 = (ulong)((long)psVar11 - (long)psVar13) >> 4;
    if (((int)uVar1 < 0) || ((int)uVar12 <= (int)uVar1)) {
      aAppDebugPrintf("[CRASH] Program vertex source OOB %d (max %d)",(ulong)uVar1,
                      uVar12 & 0xffffffff);
      aAppTerminate(-1);
      psVar13 = (this->sources_).
                super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar11 = (this->sources_).
                super__Vector_base<std::shared_ptr<PolledShaderSource>,_std::allocator<std::shared_ptr<PolledShaderSource>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    iVar8 = pPVar17->fragment;
    if ((iVar8 < 0) || ((int)((ulong)((long)psVar11 - (long)psVar13) >> 4) <= iVar8)) {
      aAppDebugPrintf("[CRASH] Program fragment source OOB %d (max %d)");
      aAppTerminate(-1);
      psVar13 = ((_Vector_impl_data *)&(((path *)local_78._32_8_)->_M_pathname)._M_dataplus)->
                _M_start;
      iVar8 = pPVar17->fragment;
    }
    std::vector<PolledShaderProgram,std::allocator<PolledShaderProgram>>::
    emplace_back<Expected<std::__cxx11::string,std::__cxx11::string>(&)(shader::Source_const&),std::shared_ptr<PolledShaderSource>&,std::shared_ptr<PolledShaderSource>&>
              ((vector<PolledShaderProgram,std::allocator<PolledShaderProgram>> *)local_78._56_8_,
               shaderPreprocessor_abi_cxx11_,psVar13 + pPVar17->vertex,psVar13 + iVar8);
  }
  return;
}

Assistant:

VideoEngine::VideoEngine(Resources &resources, const std::shared_ptr<renderdesc::Pipeline> &pipeline)
	: resources_(resources)
	, pipeline_(pipeline)
{
	for (const auto& t: pipeline->textures) {
		if (t.file.empty()) {
			textures_.emplace_back(std::shared_ptr<PolledTexture>(new PolledTexture(t.w, t.h, t.pixel_type)));
		} else {
			textures_.emplace_back(resources_.getTexture(t.file));
		}
	}

	for (const auto& f: pipeline->framebuffers) {
		Framebuffer fb;
		GL(glBindFramebuffer(GL_FRAMEBUFFER, fb.name));
		for (int i = 0; i < f.textures_count; ++i) {
			const int index = f.textures[i];
			if (index < 0 || index >= (int)textures_.size())
				CRASH("Fb texture %d OOB %d (max %d)", i, index, (int)textures_.size());

			if (!fb.attachColorTexture(i, textures_[index]->texture()))
				CRASH("Framebuffer %d is not complete", (int)framebuffer_.size());
		}

		fb.num_targets = f.textures_count;

		framebuffer_.push_back(std::move(fb));
	}

	GL(glBindFramebuffer(GL_FRAMEBUFFER, 0));

	for (const auto& s: pipeline->shader_filenames)
		sources_.emplace_back(resources_.getShaderSource(s));

	for (const auto& p: pipeline->programs) {
		if (p.vertex < 0 || p.vertex >= (int)sources_.size())
			CRASH("Program vertex source OOB %d (max %d)", p.vertex, (int)sources_.size());
		if (p.fragment < 0 || p.fragment >= (int)sources_.size())
			CRASH("Program fragment source OOB %d (max %d)", p.fragment, (int)sources_.size());

		programs_.emplace_back(shaderPreprocessor, sources_[p.vertex], sources_[p.fragment]);
	}
}